

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O3

void __thiscall
VulkanUtilities::VulkanMemoryPage::Free(VulkanMemoryPage *this,VulkanMemoryAllocation *Allocation)

{
  atomic<long> *paVar1;
  int iVar2;
  VulkanMemoryAllocation local_38;
  
  LOCK();
  paVar1 = (this->m_ParentMemoryMgr->m_CurrUsedSize)._M_elems + (this->m_CPUMemory != (void *)0x0);
  (paVar1->super___atomic_base<long>)._M_i =
       (paVar1->super___atomic_base<long>)._M_i - Allocation->Size;
  UNLOCK();
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar2 == 0) {
    Diligent::VariableSizeAllocationsManager::Free
              (&this->m_AllocationMgr,Allocation->UnalignedOffset,Allocation->Size);
    Allocation->Page = (VulkanMemoryPage *)0x0;
    Allocation->UnalignedOffset = 0;
    Allocation->Size = 0;
    local_38.Size = 0;
    local_38.Page = (VulkanMemoryPage *)0x0;
    local_38.UnalignedOffset = 0;
    VulkanMemoryAllocation::~VulkanMemoryAllocation(&local_38);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void VulkanMemoryPage::Free(VulkanMemoryAllocation&& Allocation)
{
    m_ParentMemoryMgr.OnFreeAllocation(Allocation.Size, m_CPUMemory != nullptr);
    std::lock_guard<std::mutex> Lock{m_Mutex};
    VERIFY_EXPR(Allocation.UnalignedOffset <= std::numeric_limits<AllocationsMgrOffsetType>::max());
    VERIFY_EXPR(Allocation.Size <= std::numeric_limits<AllocationsMgrOffsetType>::max());
    m_AllocationMgr.Free(static_cast<AllocationsMgrOffsetType>(Allocation.UnalignedOffset), static_cast<AllocationsMgrOffsetType>(Allocation.Size));
    Allocation = VulkanMemoryAllocation{};
}